

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutGeneration.cpp
# Opt level: O3

bool __thiscall HighsCutGeneration::separateLiftedMixedBinaryCover(HighsCutGeneration *this)

{
  HighsCDouble *this_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end;
  ulong uVar1;
  double *pdVar2;
  HighsInt i;
  int bad_allowed;
  uint uVar3;
  bool bVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin;
  uint uVar5;
  ulong uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  HighsCDouble HVar14;
  vector<double,_std::allocator<double>_> S;
  vector<unsigned_char,_std::allocator<unsigned_char>_> coverflag;
  vector<double,_std::allocator<double>_> local_88;
  double local_68;
  undefined8 uStack_60;
  long local_58;
  double local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  this->integralSupport = false;
  this->integralCoefficients = false;
  uVar6 = (ulong)((long)(this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar5 = (uint)uVar6;
  std::vector<double,_std::allocator<double>_>::resize(&local_88,(long)(int)uVar5);
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_48,(long)this->rowlen);
  if (uVar5 != 0) {
    uVar6 = uVar6 & 0xffffffff;
    uVar1 = 0;
    do {
      local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start
      [(this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start[uVar1]] = '\x01';
      uVar1 = uVar1 + 1;
    } while (uVar6 != uVar1);
    begin._M_current =
         (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
         ._M_start;
    end._M_current =
         (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
         ._M_finish;
    if (begin._M_current != end._M_current) {
      uVar1 = (long)end._M_current - (long)begin._M_current >> 2;
      bad_allowed = 0;
      if (1 < uVar1) {
        bad_allowed = 0;
        do {
          uVar1 = (long)uVar1 >> 1;
          bad_allowed = bad_allowed + 1;
        } while (1 < uVar1);
      }
      pdqsort_detail::
      pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::separateLiftedMixedBinaryCover()::__0,true>
                (begin,end,(anon_class_8_1_8991fb9c)this,bad_allowed,true);
      begin._M_current =
           (this->cover).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    pdVar2 = this->vals;
    this_00 = &this->lambda;
    dVar12 = 0.0;
    uVar1 = 0;
    dVar9 = 0.0;
    do {
      dVar10 = pdVar2[begin._M_current[uVar1]];
      dVar11 = (this->lambda).hi;
      dVar13 = dVar10 - dVar11;
      if ((((dVar10 - (dVar11 + dVar13)) + (-dVar11 - (dVar13 - (dVar11 + dVar13)))) -
          (this->lambda).lo) + dVar13 <= this->epsilon) {
        uVar5 = (uint)uVar1;
        break;
      }
      dVar11 = dVar9 + dVar10;
      dVar12 = dVar12 + (dVar9 - (dVar11 - dVar10)) + (dVar10 - (dVar11 - (dVar11 - dVar10)));
      local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar1] = dVar11 + dVar12;
      uVar1 = uVar1 + 1;
      dVar9 = dVar11;
    } while (uVar6 != uVar1);
    if (uVar5 != 0) {
      uVar3 = *(uint *)((long)&(this->lambda).hi + 4);
      dVar12 = (this->lambda).lo;
      *(undefined4 *)&(this->rhs).hi = *(undefined4 *)&(this->lambda).hi;
      *(uint *)((long)&(this->rhs).hi + 4) = uVar3 ^ 0x80000000;
      *(int *)&(this->rhs).lo = SUB84(dVar12,0);
      *(uint *)((long)&(this->rhs).lo + 4) = (uint)((ulong)dVar12 >> 0x20) ^ 0x80000000;
      this->integralSupport = true;
      this->integralCoefficients = false;
      uVar3 = this->rowlen;
      bVar4 = true;
      if (uVar3 != 0) {
        local_50 = (double)(int)uVar5;
        local_58 = (long)(int)uVar5;
        uVar6 = 0;
        do {
          if ((this->isintegral).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar6] == '\0') {
            if (0.0 < pdVar2[uVar6] || pdVar2[uVar6] == 0.0) {
              pdVar2[uVar6] = 0.0;
            }
            else {
              this->integralSupport = false;
            }
          }
          else if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar6] == '\0') {
            local_68 = pdVar2[uVar6];
            uStack_60 = 0;
            if (0 < (int)uVar5) {
              dVar12 = (this->lambda).hi;
              uVar1 = 0;
              do {
                dVar9 = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar1];
                dVar10 = dVar9 - dVar12;
                if (local_68 <=
                    (((dVar9 - (dVar12 + dVar10)) + (-dVar12 - (dVar10 - (dVar12 + dVar10)))) -
                    (this->lambda).lo) + dVar10) {
                  HVar14 = HighsCDouble::operator*(this_00,(double)(int)uVar1);
                  dVar12 = HVar14.hi + HVar14.lo;
                  goto LAB_0027c182;
                }
                if (local_68 <= dVar9) {
                  HVar14 = HighsCDouble::operator*(this_00,(double)((int)uVar1 + 1));
                  dVar10 = HVar14.lo;
                  uVar7 = HVar14.hi._0_4_;
                  uVar8 = HVar14.hi._4_4_;
                  dVar9 = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar1];
                  goto LAB_0027c124;
                }
                uVar1 = uVar1 + 1;
              } while (uVar5 != uVar1);
            }
            HVar14 = HighsCDouble::operator*(this_00,local_50);
            dVar10 = HVar14.lo;
            uVar7 = HVar14.hi._0_4_;
            uVar8 = HVar14.hi._4_4_;
            dVar9 = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[local_58 + -1];
LAB_0027c124:
            dVar13 = local_68 - dVar9;
            dVar12 = (double)CONCAT44(uVar8,uVar7) + dVar13;
            dVar11 = dVar12 - (double)CONCAT44(uVar8,uVar7);
            dVar12 = dVar10 + (dVar13 - dVar11) +
                              ((double)CONCAT44(uVar8,uVar7) - (dVar12 - dVar11)) +
                     (-dVar9 - (dVar13 - local_68)) + (local_68 - (dVar13 - (dVar13 - local_68))) +
                     0.0 + dVar12;
LAB_0027c182:
            pdVar2 = this->vals;
            pdVar2[uVar6] = dVar12;
            uVar3 = this->rowlen;
          }
          else {
            dVar12 = (this->lambda).hi + (this->lambda).lo;
            if (pdVar2[uVar6] <= dVar12) {
              dVar12 = pdVar2[uVar6];
            }
            pdVar2[uVar6] = dVar12;
            dVar9 = (this->rhs).hi;
            dVar10 = dVar9 + dVar12;
            (this->rhs).hi = dVar10;
            (this->rhs).lo =
                 (dVar9 - (dVar10 - dVar12)) + (dVar12 - (dVar10 - (dVar10 - dVar12))) +
                 (this->rhs).lo;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar3);
        bVar4 = true;
      }
      goto LAB_0027c1aa;
    }
  }
  bVar4 = false;
LAB_0027c1aa:
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar4;
}

Assistant:

bool HighsCutGeneration::separateLiftedMixedBinaryCover() {
  // initialize indicators
  integralSupport = false;
  integralCoefficients = false;

  HighsInt coversize = cover.size();
  std::vector<double> S;
  S.resize(coversize);
  std::vector<uint8_t> coverflag;
  coverflag.resize(rowlen);

  if (coversize == 0) return false;

  for (HighsInt i = 0; i != coversize; ++i) coverflag[cover[i]] = 1;

  pdqsort_branchless(cover.begin(), cover.end(),
                     [&](HighsInt a, HighsInt b) { return vals[a] > vals[b]; });
  HighsCDouble sum = 0;

  HighsInt p = coversize;
  for (HighsInt i = 0; i != coversize; ++i) {
    if (vals[cover[i]] - lambda <= epsilon) {
      p = i;
      break;
    }
    sum += vals[cover[i]];
    S[i] = double(sum);
  }
  if (p == 0) return false;
  /* define the lifting function */
  auto phi = [&](double a) {
    for (HighsInt i = 0; i < p; ++i) {
      if (a <= S[i] - lambda) return double(i * lambda);

      if (a <= S[i]) return double((i + 1) * lambda + (HighsCDouble(a) - S[i]));
    }

    return double(p * lambda + (HighsCDouble(a) - S[p - 1]));
  };

  rhs = -lambda;

  integralCoefficients = false;
  integralSupport = true;
  for (HighsInt i = 0; i != rowlen; ++i) {
    if (!isintegral[i]) {
      if (vals[i] < 0)
        integralSupport = false;
      else
        vals[i] = 0;
      continue;
    }

    if (coverflag[i]) {
      vals[i] = std::min(vals[i], double(lambda));
      rhs += vals[i];
    } else {
      vals[i] = phi(vals[i]);
    }
  }

  return true;
}